

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_api_suite::test_clear(void)

{
  undefined8 local_38;
  undefined4 local_2c;
  
  local_38 = 4;
  local_2c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x37,"void mean_api_suite::test_clear()",&local_38,&local_2c);
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x39,"void mean_api_suite::test_clear()",&local_38,&local_2c);
  return;
}

Assistant:

void test_clear()
{
    interim::moment<double, 4> filter;
    filter.push(1.0);
    filter.push(2.0);
    filter.push(3.0);
    filter.push(4.0);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
}